

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-writer.c
# Opt level: O0

void labpack_write_str(labpack_writer_t *writer,char *value,uint32_t length)

{
  _Bool _Var1;
  uint32_t length_local;
  char *value_local;
  labpack_writer_t *writer_local;
  
  if (writer == (labpack_writer_t *)0x0) {
    __assert_fail("writer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-writer.c"
                  ,0x198,"void labpack_write_str(labpack_writer_t *, const char *, uint32_t)");
  }
  _Var1 = labpack_writer_is_ok(writer);
  if (_Var1) {
    if ((value == (char *)0x0) && (length != 0)) {
      writer->status = LABPACK_STATUS_ERROR_NULL_VALUE;
      writer->status_message = NULL_STRING_MESSAGE;
    }
    else {
      mpack_write_str(writer->encoder,value,length);
      labpack_writer_check_encoder(writer);
    }
  }
  return;
}

Assistant:

void
labpack_write_str(labpack_writer_t* writer, const char* value, uint32_t length)
{
    assert(writer);
    if (labpack_writer_is_ok(writer)) {
        if (!value && length > 0) {
            writer->status = LABPACK_STATUS_ERROR_NULL_VALUE;
            writer->status_message = NULL_STRING_MESSAGE;
            return;
        }
        mpack_write_str(writer->encoder, value, length);
        labpack_writer_check_encoder(writer);
    }
}